

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::LogGamma::backward_impl
          (LogGamma *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  Index size;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined4 uVar14;
  float fVar15;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_5d;
  float local_5c;
  undefined4 local_58;
  uint uStack_54;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  pTVar1 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar11 = (ulong)(pTVar1->d).nd;
  iVar6 = 1;
  iVar8 = 1;
  if (uVar11 != 0) {
    uVar9 = 0;
    do {
      iVar8 = iVar8 * (pTVar1->d).d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  uVar11 = (ulong)(dEdf->d).nd;
  if (uVar11 != 0) {
    iVar6 = 1;
    uVar9 = 0;
    do {
      iVar6 = iVar6 * (dEdf->d).d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  uVar7 = iVar6 * (dEdf->d).bd;
  if (iVar8 * (pTVar1->d).bd == uVar7) {
    uVar11 = (ulong)(dEdxi->d).nd;
    iVar6 = 1;
    if (uVar11 != 0) {
      uVar9 = 0;
      do {
        iVar6 = iVar6 * (dEdxi->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    uVar10 = iVar6 * (dEdxi->d).bd;
    if (uVar10 == uVar7) {
      if ((ulong)uVar10 != 0) {
        pfVar2 = pTVar1->v;
        pfVar3 = dEdf->v;
        pfVar4 = dEdxi->v;
        uVar11 = 0;
        do {
          local_5c = pfVar3[uVar11];
          dVar5 = boost::math::detail::
                  digamma_imp<double,boost::integral_constant<int,24>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                            ((double)pfVar2[uVar11],(integral_constant<int,_53> *)0x0,&local_5d);
          uVar12 = SUB84(dVar5,0);
          uVar13 = (uint)((ulong)dVar5 >> 0x20);
          fVar15 = 0.0;
          uVar14 = uVar12;
          uVar7 = uVar13 & 0x7fffffff;
          if (3.4028234663852886e+38 <= ABS(dVar5) && ABS(dVar5) != 3.4028234663852886e+38) {
            local_48._8_4_ = extraout_XMM0_Dc;
            local_48._0_8_ = dVar5;
            local_48._12_4_ = extraout_XMM0_Dd;
            local_58 = uVar12;
            uStack_54 = uVar13 & 0x7fffffff;
            uStack_4c = extraout_XMM0_Dd & 0x7fffffff;
            boost::math::policies::detail::raise_error<std::overflow_error,float>
                      ("boost::math::digamma<%1%>(%1%)","numeric overflow");
            uVar12 = local_48._0_4_;
            uVar13 = local_48._4_4_;
            fVar15 = (float)local_48._0_8_;
            uVar14 = local_58;
            uVar7 = uStack_54;
          }
          if ((double)CONCAT44(uVar7,uVar14) < 3.4028234663852886e+38 ||
              (double)CONCAT44(uVar7,uVar14) == 3.4028234663852886e+38) {
            fVar15 = (float)(double)CONCAT44(uVar13,uVar12);
          }
          pfVar4[uVar11] = local_5c * fVar15 + pfVar4[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FLogGammaBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<cnn::FLogGammaBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FLogGammaBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}